

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O0

void predict_or_learn<true>(multi_oaa *o,single_learner *base,example *ec)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  uint *puVar6;
  ulong uVar7;
  ostream *poVar8;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i;
  uint32_t multilabel_index;
  labels preds;
  labels multilabels;
  uint *in_stack_ffffffffffffff78;
  v_array<unsigned_int> *in_stack_ffffffffffffff80;
  example *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar9;
  uint local_68;
  v_array<unsigned_int> local_38;
  long local_18;
  ulong *local_8;
  
  local_38._begin = *(uint **)(in_RDX + 0x6828);
  local_38._end = *(uint **)(in_RDX + 0x6830);
  local_38.end_array = *(uint **)(in_RDX + 0x6838);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6840);
  uVar1 = *(undefined8 *)(in_RDX + 0x6850);
  uVar2 = *(undefined8 *)(in_RDX + 0x6858);
  uVar3 = *(undefined8 *)(in_RDX + 0x6860);
  uVar4 = *(undefined8 *)(in_RDX + 0x6868);
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<unsigned_int>::clear(in_stack_ffffffffffffff80);
  *(undefined8 *)(local_18 + 0x6828) = 0x3f8000007f7fffff;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  local_68 = 0;
  for (uVar9 = 0; (ulong)uVar9 < *local_8; uVar9 = uVar9 + 1) {
    *(undefined4 *)(local_18 + 0x6828) = 0xbf800000;
    sVar5 = v_array<unsigned_int>::size(&local_38);
    if (local_68 < sVar5) {
      puVar6 = v_array<unsigned_int>::operator[](&local_38,(ulong)local_68);
      if (*puVar6 == uVar9) {
        *(undefined4 *)(local_18 + 0x6828) = 0x3f800000;
        local_68 = local_68 + 1;
      }
    }
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)CONCAT44(uVar9,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
    if (0.0 < *(float *)(local_18 + 0x6850)) {
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  uVar7 = (ulong)local_68;
  sVar5 = v_array<unsigned_int>::size(&local_38);
  if (uVar7 < sVar5) {
    poVar8 = std::operator<<((ostream *)&std::cout,"label ");
    puVar6 = v_array<unsigned_int>::operator[](&local_38,(ulong)local_68);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*puVar6);
    poVar8 = std::operator<<(poVar8," is not in {0,");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_8 - 1);
    poVar8 = std::operator<<(poVar8,"} This won\'t work right.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  *(undefined8 *)(local_18 + 0x6850) = uVar1;
  *(undefined8 *)(local_18 + 0x6858) = uVar2;
  *(undefined8 *)(local_18 + 0x6860) = uVar3;
  *(undefined8 *)(local_18 + 0x6868) = uVar4;
  *(uint **)(local_18 + 0x6828) = local_38._begin;
  *(uint **)(local_18 + 0x6830) = local_38._end;
  *(uint **)(local_18 + 0x6838) = local_38.end_array;
  *(size_t *)(local_18 + 0x6840) = local_38.erase_count;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}